

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_set_data(Integer g_a,Integer ndim,Integer *dims,Integer type)

{
  long lVar1;
  Integer IVar2;
  Integer in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int _d;
  Integer ga_handle;
  Integer i;
  Integer in_stack_00000168;
  char *in_stack_00000170;
  int local_34;
  long local_28;
  
  lVar1 = in_RDI + 1000;
  if (GA[lVar1].actv == 1) {
    pnga_error(in_stack_00000170,in_stack_00000168);
  }
  if ((in_RSI < 1) || (7 < in_RSI)) {
    pnga_error(in_stack_00000170,in_stack_00000168);
  }
  for (local_34 = 0; local_34 < in_RSI; local_34 = local_34 + 1) {
    if (*(long *)(in_RDX + (long)local_34 * 8) < 1) {
      pnga_error(in_stack_00000170,in_stack_00000168);
    }
  }
  IVar2 = pnga_type_f2c(in_RCX);
  if (999 < IVar2) {
    IVar2 = pnga_type_f2c(in_RCX);
    if (IVar2 < 0x4e8) {
      IVar2 = pnga_type_f2c(in_RCX);
      if (ga_types[IVar2 + -1000].active != 0) goto LAB_001c0917;
    }
  }
  pnga_type_f2c(in_RCX);
  pnga_error(in_stack_00000170,in_stack_00000168);
LAB_001c0917:
  IVar2 = pnga_type_f2c((long)(int)in_RCX);
  GA[lVar1].type = (int)IVar2;
  GA[lVar1].elemsize = (int)ga_types[GA[lVar1].type + -1000].size;
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    GA[lVar1].dims[local_28] = *(C_Integer *)(in_RDX + local_28 * 8);
    GA[lVar1].chunk[local_28] = 0;
    GA[lVar1].width[local_28] = 0;
  }
  GA[lVar1].ndim = (short)in_RSI;
  return;
}

Assistant:

void pnga_set_data(Integer g_a, Integer ndim, Integer *dims, Integer type)
{
  Integer i;
  Integer ga_handle = g_a + GA_OFFSET;
  if (GA[ga_handle].actv == 1)
    pnga_error("Cannot set data on array that has been allocated",0);
  gam_checkdim(ndim, dims);
  gam_checktype(pnga_type_f2c(type));

  GA[ga_handle].type = pnga_type_f2c((int)(type));
  GA[ga_handle].elemsize = GAsizeofM(GA[ga_handle].type);

  for (i=0; i<ndim; i++) {
    GA[ga_handle].dims[i] = (C_Integer)dims[i];
    GA[ga_handle].chunk[i] = 0;
    GA[ga_handle].width[i] = 0;
  }
  GA[ga_handle].ndim = (int)(ndim);
}